

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  long lVar12;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  DIdxSet *local_68;
  DIdxSet *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48 [2];
  undefined8 uStack_40;
  uint local_38 [2];
  
  pUVar2 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  entertol(&local_a0,this);
  lVar12 = (long)(pUVar2->thedelta).super_IdxSet.num;
  if (0 < lVar12) {
    local_68 = &this->updateViols;
    local_a8 = &(this->m_pricingViol).m_backend;
    local_60 = &this->infeasibilities;
    lVar12 = lVar12 + 1;
    do {
      iVar8 = (pUVar2->thedelta).super_IdxSet.idx[lVar12 + -2];
      if (this->m_pricingViolUpToDate == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        uVar5 = local_e8.data._M_elems._0_8_;
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        if (local_e8.data._M_elems[0] != 0 || local_a0.m_backend.fpclass != cpp_dec_float_finite) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        local_e8.data._M_elems._0_8_ = uVar5;
        if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
            (pcVar10->fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar10,&local_e8), iVar7 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (local_a8,&(this->theCoTest).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
        }
      }
      pnVar3 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((*(fpclass_type *)((long)(pnVar3 + iVar8) + 0x30) == cpp_dec_float_NaN) ||
          (pnVar4 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar4[iVar8].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&pnVar3[iVar8].m_backend,&pnVar4[iVar8].m_backend), iVar7 < 1)) {
        pcVar11 = &(this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        pcVar10 = &(this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems._24_5_ = 0;
        local_e8.data._M_elems[7]._1_3_ = 0;
        local_e8.data._M_elems._32_5_ = 0;
        local_e8.data._M_elems[9]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        if (&local_e8 == pcVar10) goto LAB_00268603;
        if (&local_e8 != pcVar11) {
          uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
          local_e8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
          local_e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
          local_e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
          local_e8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_e8.exp = pcVar11->exp;
          local_e8.neg = pcVar11->neg;
          local_e8.fpclass = pcVar11->fpclass;
          local_e8.prec_elem = pcVar11->prec_elem;
        }
LAB_002685f1:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_e8,pcVar10);
      }
      else {
        pcVar11 = &(this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        pcVar10 = &(this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems._24_5_ = 0;
        local_e8.data._M_elems[7]._1_3_ = 0;
        local_e8.data._M_elems._32_5_ = 0;
        local_e8.data._M_elems[9]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        if (&local_e8 != pcVar10) {
          if (&local_e8 != pcVar11) {
            uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
            local_e8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
            local_e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
            local_e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
            local_e8.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_e8.exp = pcVar11->exp;
            local_e8.neg = pcVar11->neg;
            local_e8.fpclass = pcVar11->fpclass;
            local_e8.prec_elem = pcVar11->prec_elem;
          }
          goto LAB_002685f1;
        }
LAB_00268603:
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 10;
        local_e8.neg = false;
        local_e8.exp = 0;
        local_e8.data._M_elems[9]._1_3_ = 0;
        local_e8.data._M_elems._32_5_ = 0;
        local_e8.data._M_elems[7]._1_3_ = 0;
        local_e8.data._M_elems._24_5_ = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_e8,pcVar11);
        if (local_e8.data._M_elems[0] != 0 || local_e8.fpclass != cpp_dec_float_finite) {
          local_e8.neg = (bool)(local_e8.neg ^ 1);
        }
      }
      pnVar3 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar3[iVar8].m_backend.data + 0x20) =
           CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar3[iVar8].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
      *(undefined8 *)&pnVar3[iVar8].m_backend.data = local_e8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar3[iVar8].m_backend.data + 8) = local_e8.data._M_elems._8_8_;
      pnVar3[iVar8].m_backend.exp = local_e8.exp;
      pnVar3[iVar8].m_backend.neg = local_e8.neg;
      pnVar3[iVar8].m_backend.fpclass = local_e8.fpclass;
      pnVar3[iVar8].m_backend.prec_elem = local_e8.prec_elem;
      if (this->sparsePricingLeave == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        uVar5 = local_e8.data._M_elems._0_8_;
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        if (local_e8.data._M_elems[0] != 0 || local_a0.m_backend.fpclass != cpp_dec_float_finite) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        local_e8.data._M_elems._0_8_ = uVar5;
        if (((local_a0.m_backend.fpclass == cpp_dec_float_NaN) ||
            (pcVar10->fpclass == cpp_dec_float_NaN)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar10,&local_e8), -1 < iVar7)) goto LAB_002686e8;
        if (this->m_pricingViolUpToDate == true) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (local_a8,&(this->theCoTest).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
        }
        if ((this->isInfeasible).data[iVar8] == 0) {
          DIdxSet::addIdx(local_60,iVar8);
          (this->isInfeasible).data[iVar8] = 1;
        }
        if (this->hyperPricingLeave == true) {
          DIdxSet::addIdx(local_68,iVar8);
        }
      }
      else {
LAB_002686e8:
        if (this->m_pricingViolUpToDate == true) {
          pcVar10 = &(this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
          local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
          uVar5 = local_e8.data._M_elems._0_8_;
          local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
          local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
          local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
          local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
          local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
          local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
          local_e8.exp = local_a0.m_backend.exp;
          local_e8.neg = local_a0.m_backend.neg;
          local_e8.fpclass = local_a0.m_backend.fpclass;
          local_e8.prec_elem = local_a0.m_backend.prec_elem;
          local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
          if (local_e8.data._M_elems[0] != 0 || local_a0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
          }
          local_e8.data._M_elems._0_8_ = uVar5;
          if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar10->fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar10,&local_e8), iVar7 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (local_a8,&(this->theCoTest).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
          }
        }
      }
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  if (0 < this->boundflips) {
    a = Tolerances::epsilon((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_e8,a);
    pSVar9 = this->solveVector3;
    if (0 < (pSVar9->super_IdxSet).num) {
      local_a8 = &(this->m_pricingViol).m_backend;
      local_68 = &this->infeasibilities;
      lVar12 = 0;
      do {
        pnVar4 = (pSVar9->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = (pSVar9->super_IdxSet).idx[lVar12];
        local_128.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar4[iVar8].m_backend.data + 0x20)
        ;
        pnVar3 = pnVar4 + iVar8;
        local_58 = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
        uStack_50 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 8);
        puVar1 = (uint *)((long)&pnVar4[iVar8].m_backend.data + 0x10);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uStack_40 = *(undefined8 *)(puVar1 + 2);
        local_128.exp = pnVar4[iVar8].m_backend.exp;
        local_128.neg = pnVar4[iVar8].m_backend.neg;
        local_128.fpclass = pnVar4[iVar8].m_backend.fpclass;
        local_128.prec_elem = pnVar4[iVar8].m_backend.prec_elem;
        local_128.data._M_elems._24_5_ = SUB85(uStack_40,0);
        local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
        if ((local_128.neg == true) &&
           (local_128.data._M_elems[0] = (uint)local_58,
           local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
          local_128.neg = false;
        }
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_e8.fpclass != cpp_dec_float_NaN)) &&
           (local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])&(pnVar3->m_backend).data,
           local_48 = (uint  [2])local_128.data._M_elems._16_8_,
           local_38 = (uint  [2])local_128.data._M_elems._32_8_,
           iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_128,&local_e8), 0 < iVar8)) {
          iVar8 = (this->solveVector3->super_IdxSet).idx[lVar12];
          if (this->m_pricingViolUpToDate == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            local_128.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
            local_128.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
            local_128.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
            local_128.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
            auVar6 = (undefined1  [16])local_128.data._M_elems._0_16_;
            local_128.data._M_elems[8] = local_a0.m_backend.data._M_elems[8];
            local_128.data._M_elems[9] = local_a0.m_backend.data._M_elems[9];
            local_128.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
            local_128.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
            local_128.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
            local_128.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
            local_128.exp = local_a0.m_backend.exp;
            local_128.neg = local_a0.m_backend.neg;
            local_128.fpclass = local_a0.m_backend.fpclass;
            local_128.prec_elem = local_a0.m_backend.prec_elem;
            local_128.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
            if (local_128.data._M_elems[0] != 0 ||
                local_a0.m_backend.fpclass != cpp_dec_float_finite) {
              local_128.neg = (bool)(local_a0.m_backend.neg ^ 1);
            }
            local_128.data._M_elems._0_16_ = auVar6;
            if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_128), iVar7 < 0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_a8,&(this->theCoTest).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
            }
          }
          pnVar3 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((*(fpclass_type *)((long)(pnVar3 + iVar8) + 0x30) == cpp_dec_float_NaN) ||
              (pnVar4 = (this->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              pnVar4[iVar8].m_backend.fpclass == cpp_dec_float_NaN)) ||
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&pnVar3[iVar8].m_backend,&pnVar4[iVar8].m_backend), iVar7 < 1)) {
            pcVar11 = &(this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            pcVar10 = &(this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems[8] = 0;
            local_128.data._M_elems[9] = 0;
            local_128.exp = 0;
            local_128.neg = false;
            if (&local_128 == pcVar10) goto LAB_00268b4f;
            if (&local_128 != pcVar11) {
              local_128.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_128.data._M_elems._24_5_ = SUB85(uVar5,0);
              local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              local_128.exp = pcVar11->exp;
              local_128.neg = pcVar11->neg;
              local_128.fpclass = pcVar11->fpclass;
              local_128.prec_elem = pcVar11->prec_elem;
            }
LAB_00268b3d:
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_128,pcVar10);
          }
          else {
            pcVar11 = &(this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            pcVar10 = &(this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems[8] = 0;
            local_128.data._M_elems[9] = 0;
            local_128.exp = 0;
            local_128.neg = false;
            if (&local_128 != pcVar10) {
              if (&local_128 != pcVar11) {
                local_128.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
                local_128.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar5 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_128.data._M_elems._24_5_ = SUB85(uVar5,0);
                local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                local_128.exp = pcVar11->exp;
                local_128.neg = pcVar11->neg;
                local_128.fpclass = pcVar11->fpclass;
                local_128.prec_elem = pcVar11->prec_elem;
              }
              goto LAB_00268b3d;
            }
LAB_00268b4f:
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.neg = false;
            local_128.exp = 0;
            local_128.data._M_elems[8] = 0;
            local_128.data._M_elems[9] = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_128,pcVar11);
            if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
              local_128.neg = (bool)(local_128.neg ^ 1);
            }
          }
          pnVar3 = (this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar3[iVar8].m_backend.data + 0x20) =
               local_128.data._M_elems._32_8_;
          puVar1 = (uint *)((long)&pnVar3[iVar8].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
          *(undefined8 *)&pnVar3[iVar8].m_backend.data = local_128.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar3[iVar8].m_backend.data + 8) = local_128.data._M_elems._8_8_;
          pnVar3[iVar8].m_backend.exp = local_128.exp;
          pnVar3[iVar8].m_backend.neg = local_128.neg;
          pnVar3[iVar8].m_backend.fpclass = local_128.fpclass;
          pnVar3[iVar8].m_backend.prec_elem = local_128.prec_elem;
          if (this->sparsePricingLeave == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            local_128.data._M_elems[8] = local_a0.m_backend.data._M_elems[8];
            local_128.data._M_elems[9] = local_a0.m_backend.data._M_elems[9];
            local_128.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
            local_128.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
            local_128.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
            local_128.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
            local_128.exp = local_a0.m_backend.exp;
            local_128.neg = local_a0.m_backend.neg;
            local_128.fpclass = local_a0.m_backend.fpclass;
            local_128.prec_elem = local_a0.m_backend.prec_elem;
            local_128.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
            if (local_128.data._M_elems[0] != 0 ||
                local_a0.m_backend.fpclass != cpp_dec_float_finite) {
              local_128.neg = (bool)(local_a0.m_backend.neg ^ 1);
            }
            if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_128), iVar7 < 0)) {
              if (this->m_pricingViolUpToDate == true) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (local_a8,&(this->theCoTest).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
              }
              if ((this->isInfeasible).data[iVar8] == 0) {
                DIdxSet::addIdx(local_68,iVar8);
                (this->isInfeasible).data[iVar8] = 1;
              }
              goto LAB_00268d16;
            }
          }
          if (this->m_pricingViolUpToDate == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            local_128.data._M_elems[8] = local_a0.m_backend.data._M_elems[8];
            local_128.data._M_elems[9] = local_a0.m_backend.data._M_elems[9];
            local_128.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
            local_128.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
            local_128.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
            local_128.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
            local_128.exp = local_a0.m_backend.exp;
            local_128.neg = local_a0.m_backend.neg;
            local_128.fpclass = local_a0.m_backend.fpclass;
            local_128.prec_elem = local_a0.m_backend.prec_elem;
            local_128.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
            if (local_128.data._M_elems[0] != 0 ||
                local_a0.m_backend.fpclass != cpp_dec_float_finite) {
              local_128.neg = (bool)(local_a0.m_backend.neg ^ 1);
            }
            if (((local_a0.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar10,&local_128), iVar7 < 0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (local_a8,&(this->theCoTest).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend);
            }
          }
        }
LAB_00268d16:
        lVar12 = lVar12 + 1;
        pSVar9 = this->solveVector3;
      } while (lVar12 < (pSVar9->super_IdxSet).num);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}